

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::SwitchStmt::remove_stmt(SwitchStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var3 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->body_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var2 = *(_Base_ptr *)(p_Var3[1]._M_left + 6);
    p_Var1 = p_Var3[1]._M_left[6]._M_parent;
    if (p_Var2 != p_Var1) {
      do {
        if (*(element_type **)p_Var2 ==
            (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
          remove_switch_case(this,(shared_ptr<kratos::Const> *)(p_Var3 + 1),stmt);
          break;
        }
        p_Var2 = (_Base_ptr)&p_Var2->_M_left;
      } while (p_Var2 != p_Var1);
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

void SwitchStmt::remove_stmt(const std::shared_ptr<kratos::Stmt> &stmt) {
    for (auto &[c, stmts] : body_) {
        for (auto const &s : *stmts) {
            if (s == stmt) {
                remove_switch_case(c, stmt);
                break;
            }
        }
    }
}